

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_server.cpp
# Opt level: O0

void __thiscall cppcms::impl::garbage_collector::run(garbage_collector *this)

{
  exception *e;
  error_code *in_stack_ffffffffffffff50;
  error_code *in_stack_ffffffffffffffa8;
  garbage_collector *in_stack_ffffffffffffffb0;
  
  std::error_code::error_code(in_stack_ffffffffffffff50);
  async_run(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  booster::aio::io_service::run();
  return;
}

Assistant:

void run()
	{
		try {
			async_run(booster::system::error_code());
			srv_.run();
		}
		catch(std::exception const &e) {
			BOOSTER_ERROR("cppcms_scale") << "garbage_collector::run: " << 
				e.what() << booster::trace(e);
		}
	}